

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> * __thiscall
capnp::compiler::Compiler::Node::resolveImport
          (Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *__return_storage_ptr__,
          Node *this,StringPtr name)

{
  ResolvedDecl local_b0;
  Node *local_50;
  Node *root;
  char *local_40;
  Maybe<capnp::compiler::Compiler::CompiledModule_&> local_38;
  CompiledModule *local_30;
  CompiledModule *m;
  Node *this_local;
  StringPtr name_local;
  
  local_40 = (char *)name.content.size_;
  root = (Node *)name.content.ptr;
  m = (CompiledModule *)this;
  this_local = root;
  name_local.content.ptr = local_40;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  local_38 = CompiledModule::importRelative(this->module,name);
  local_30 = kj::_::readMaybe<capnp::compiler::Compiler::CompiledModule>(&local_38);
  if (local_30 == (CompiledModule *)0x0) {
    kj::Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::Maybe
              (__return_storage_ptr__,(void *)0x0);
  }
  else {
    local_b0.resolver = &CompiledModule::getRootNode(local_30)->super_Resolver;
    local_b0.id = ((Node *)local_b0.resolver)->id;
    local_b0.genericParamCount = 0;
    local_b0.scopeId = 0;
    local_b0.kind = ((Node *)local_b0.resolver)->kind;
    local_50 = (Node *)local_b0.resolver;
    kj::Maybe<capnp::schema::Brand::Reader>::Maybe(&local_b0.brand,(void *)0x0);
    kj::Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::Maybe
              (__return_storage_ptr__,&local_b0);
    NodeTranslator::Resolver::ResolvedDecl::~ResolvedDecl(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolvedDecl>
Compiler::Node::resolveImport(kj::StringPtr name) {
  KJ_IF_MAYBE(m, module->importRelative(name)) {
    Node& root = m->getRootNode();
    return ResolvedDecl { root.id, 0, 0, root.kind, &root, nullptr };
  } else {
    return nullptr;
  }
}